

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_builder.c
# Opt level: O0

void ensure_cell_count(ErrorList *errors,TableRows *rows,TableRow *header,AstNode *ast_node)

{
  int iVar1;
  int iVar2;
  Location_conflict location;
  wchar_t local_3c;
  Location error_location;
  wchar_t i;
  wchar_t cell_count;
  AstNode *ast_node_local;
  TableRow *header_local;
  TableRows *rows_local;
  ErrorList *errors_local;
  
  if ((rows != (TableRows *)0x0) && (rows->row_count != L'\0')) {
    if (header == (TableRow *)0x0) {
      local_3c = rows->table_rows->table_cells->cell_count;
    }
    else {
      local_3c = header->table_cells->cell_count;
    }
    for (error_location.line = L'\0'; error_location.line < rows->row_count;
        error_location.line = error_location.line + L'\x01') {
      if ((rows->table_rows[error_location.line].table_cells)->cell_count != local_3c) {
        iVar1 = rows->table_rows[error_location.line].location.line;
        iVar2 = rows->table_rows[error_location.line].location.column;
        TableRow_delete(header);
        TableRows_delete(rows);
        AstNode_delete(ast_node);
        location.column = iVar2;
        location.line = iVar1;
        ErrorList_add_inconsisten_cell_count_error(errors,location);
      }
    }
  }
  return;
}

Assistant:

static void ensure_cell_count(ErrorList* errors, const TableRows* rows, const TableRow* header, AstNode* ast_node) {
    if (!rows || rows->row_count == 0) {
        return;
    }
    int cell_count = header ? header->table_cells->cell_count : rows->table_rows[0].table_cells->cell_count;
    int i;
    for (i = 0; i < rows->row_count; ++i) {
        if (rows->table_rows[i].table_cells->cell_count != cell_count) {
            Location error_location = {rows->table_rows[i].location.line, rows->table_rows[i].location.column};
            TableRow_delete(header);
            TableRows_delete(rows);
            AstNode_delete(ast_node);
            ErrorList_add_inconsisten_cell_count_error(errors, error_location);
        }
    }
}